

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O2

void __thiscall
ikfast::IkSolution<double>::GetSolution
          (IkSolution<double> *this,double *solution,double *freevalues)

{
  pointer pIVar1;
  pointer pIVar2;
  ulong uVar3;
  char *pcVar4;
  double dVar5;
  
  pIVar1 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (this->_vbasesol).
           super__Vector_base<ikfast::IkSingleDOFSolutionBase<double>,_std::allocator<ikfast::IkSingleDOFSolutionBase<double>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar4 = &pIVar1->freeind;
  uVar3 = 0;
  do {
    if ((ulong)(((long)pIVar2 - (long)pIVar1) / 0x18) <= uVar3) {
      return;
    }
    if ((long)*pcVar4 < 0) {
      dVar5 = *(double *)(pcVar4 + -8);
LAB_00113700:
      solution[uVar3] = dVar5;
    }
    else {
      dVar5 = freevalues[*pcVar4] * ((IkSingleDOFSolutionBase<double> *)(pcVar4 + -0x10))->fmul +
              *(double *)(pcVar4 + -8);
      solution[uVar3] = dVar5;
      if (3.14159265358979 < dVar5) {
        dVar5 = dVar5 + -6.28318530717959;
        goto LAB_00113700;
      }
      if (dVar5 < -3.14159265358979) {
        dVar5 = dVar5 + 6.28318530717959;
        goto LAB_00113700;
      }
    }
    uVar3 = uVar3 + 1;
    pcVar4 = pcVar4 + 0x18;
  } while( true );
}

Assistant:

virtual void GetSolution(T* solution, const T* freevalues) const {
        for(std::size_t i = 0; i < _vbasesol.size(); ++i) {
            if( _vbasesol[i].freeind < 0 )
                solution[i] = _vbasesol[i].foffset;
            else {
                solution[i] = freevalues[_vbasesol[i].freeind]*_vbasesol[i].fmul + _vbasesol[i].foffset;
                if( solution[i] > T(3.14159265358979) ) {
                    solution[i] -= T(6.28318530717959);
                }
                else if( solution[i] < T(-3.14159265358979) ) {
                    solution[i] += T(6.28318530717959);
                }
            }
        }
    }